

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void duckdb::ParquetScanFunction::VerifyParquetSchemaParameter(Value *schema)

{
  char cVar1;
  char *pcVar2;
  LogicalType *pLVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  *this;
  const_reference pvVar4;
  InvalidInputException *pIVar5;
  long lVar6;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l;
  allocator_type local_1b1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_1b0 [3];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_108;
  LogicalType local_f0 [24];
  LogicalType local_d8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType(local_d8,BLOB);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            (local_1b0,(char (*) [5])0x456ab5,(LogicalTypeId *)&LogicalType::VARCHAR);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            (local_1b0 + 1,(char (*) [5])0x3e4265,(LogicalTypeId *)&LogicalType::VARCHAR);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[14],_const_duckdb::LogicalTypeId_&,_true>
            (local_1b0 + 2,(char (*) [14])0x3e1af4,(LogicalTypeId *)&LogicalType::VARCHAR);
  __l._M_len = 3;
  __l._M_array = local_1b0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector(&local_108,__l,&local_1b1);
  duckdb::LogicalType::STRUCT(local_f0,&local_108);
  duckdb::LogicalType::MAP(local_40,local_d8,local_f0);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType(local_f0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_108);
  lVar6 = 0x70;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)((long)&local_1b0[0].first._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  duckdb::LogicalType::~LogicalType(local_d8);
  if (*schema != (Value)0x66) {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,"\'schema\' expects a value of type MAP, not %s",
               (allocator *)&local_1b1);
    duckdb::LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)&local_60);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar5,&local_1b0[0].first,&local_60);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)duckdb::MapType::KeyType((LogicalType *)schema);
  pLVar3 = (LogicalType *)duckdb::MapType::ValueType((LogicalType *)schema);
  if (*pLVar3 != (LogicalType)0x64) {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,"\'schema\' expects a STRUCT as the value type of the map",
               (allocator *)&local_1b1);
    duckdb::InvalidInputException::InvalidInputException(pIVar5,(string *)local_1b0);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          *)duckdb::StructType::GetChildTypes_abi_cxx11_(pLVar3);
  if ((ulong)(((long)(this->
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     ).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x38) < 3) {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,
               "\'schema\' expects the STRUCT to have 3 children, \'name\', \'type\' and \'default_value"
               ,(allocator *)&local_1b1);
    duckdb::InvalidInputException::InvalidInputException(pIVar5,(string *)local_1b0);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this,0);
  std::__cxx11::string::string((string *)local_1b0,"name",(allocator *)&local_1b1);
  cVar1 = duckdb::StringUtil::CIEquals((string *)pvVar4,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  if (cVar1 == '\0') {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,
               "\'schema\' expects the first field of the struct to be called \'name\'",
               (allocator *)&local_1b1);
    duckdb::InvalidInputException::InvalidInputException(pIVar5,(string *)local_1b0);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this,0);
  if (pvVar4->second != (LogicalType)0x19) {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,
               "\'schema\' expects the \'name\' field to be of type VARCHAR, not %s",
               (allocator *)&local_1b1);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::get<true>(this,0);
    duckdb::LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)&local_80);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar5,&local_1b0[0].first,&local_80);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this,1);
  std::__cxx11::string::string((string *)local_1b0,"type",(allocator *)&local_1b1);
  cVar1 = duckdb::StringUtil::CIEquals((string *)pvVar4,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  if (cVar1 == '\0') {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_1b0,
               "\'schema\' expects the second field of the struct to be called \'type\'",
               (allocator *)&local_1b1);
    duckdb::InvalidInputException::InvalidInputException(pIVar5,(string *)local_1b0);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this,1);
  if (pvVar4->second == (LogicalType)0x19) {
    pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::get<true>(this,2);
    std::__cxx11::string::string((string *)local_1b0,"default_value",(allocator *)&local_1b1);
    cVar1 = duckdb::StringUtil::CIEquals((string *)pvVar4,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (cVar1 == '\0') {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)local_1b0,
                 "\'schema\' expects the third field of the struct to be called \'default_value\'",
                 (allocator *)&local_1b1);
      duckdb::InvalidInputException::InvalidInputException(pIVar5,(string *)local_1b0);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((*pcVar2 != '\r') && (*pcVar2 != '\x19')) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)local_1b0,
                 "\'schema\' expects the value type of the map to be either INTEGER or VARCHAR, not %s"
                 ,(allocator *)&local_1b1);
      duckdb::LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)&local_c0);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar5,&local_1b0[0].first,&local_c0);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    return;
  }
  pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_1b0,
             "\'schema\' expects the \'type\' field to be of type VARCHAR, not %s",
             (allocator *)&local_1b1);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::get<true>(this,1);
  duckdb::LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)&local_a0);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (pIVar5,&local_1b0[0].first,&local_a0);
  __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyParquetSchemaParameter(const Value &schema) {
		LogicalType::MAP(LogicalType::BLOB, LogicalType::STRUCT({{{"name", LogicalType::VARCHAR},
		                                                          {"type", LogicalType::VARCHAR},
		                                                          {"default_value", LogicalType::VARCHAR}}}));
		auto &map_type = schema.type();
		if (map_type.id() != LogicalTypeId::MAP) {
			throw InvalidInputException("'schema' expects a value of type MAP, not %s",
			                            LogicalTypeIdToString(map_type.id()));
		}
		auto &key_type = MapType::KeyType(map_type);
		auto &value_type = MapType::ValueType(map_type);

		if (value_type.id() != LogicalTypeId::STRUCT) {
			throw InvalidInputException("'schema' expects a STRUCT as the value type of the map");
		}
		auto &children = StructType::GetChildTypes(value_type);
		if (children.size() < 3) {
			throw InvalidInputException(
			    "'schema' expects the STRUCT to have 3 children, 'name', 'type' and 'default_value");
		}
		if (!StringUtil::CIEquals(children[0].first, "name")) {
			throw InvalidInputException("'schema' expects the first field of the struct to be called 'name'");
		}
		if (children[0].second.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException("'schema' expects the 'name' field to be of type VARCHAR, not %s",
			                            LogicalTypeIdToString(children[0].second.id()));
		}
		if (!StringUtil::CIEquals(children[1].first, "type")) {
			throw InvalidInputException("'schema' expects the second field of the struct to be called 'type'");
		}
		if (children[1].second.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException("'schema' expects the 'type' field to be of type VARCHAR, not %s",
			                            LogicalTypeIdToString(children[1].second.id()));
		}
		if (!StringUtil::CIEquals(children[2].first, "default_value")) {
			throw InvalidInputException("'schema' expects the third field of the struct to be called 'default_value'");
		}
		//! NOTE: default_value can be any type

		if (key_type.id() != LogicalTypeId::INTEGER && key_type.id() != LogicalTypeId::VARCHAR) {
			throw InvalidInputException(
			    "'schema' expects the value type of the map to be either INTEGER or VARCHAR, not %s",
			    LogicalTypeIdToString(key_type.id()));
		}
	}